

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

uint32_t hydro_random_u32(void)

{
  uint32_t uVar1;
  long *in_FS_OFFSET;
  uint32_t v;
  
  hydro_random_ensure_initialized();
  if (*(byte *)(*in_FS_OFFSET + -7) < 4) {
    hydro_random_ratchet();
  }
  uVar1 = *(uint32_t *)
           (*in_FS_OFFSET + -0x40 + (long)(int)(0x10 - (uint)*(byte *)(*in_FS_OFFSET + -7)));
  *(char *)(*in_FS_OFFSET + -7) = *(char *)(*in_FS_OFFSET + -7) + -4;
  return uVar1;
}

Assistant:

uint32_t
hydro_random_u32(void)
{
    uint32_t v;

    hydro_random_ensure_initialized();
    if (hydro_random_context.available < 4) {
        hydro_random_ratchet();
    }
    memcpy(&v, &hydro_random_context.state[gimli_RATE - hydro_random_context.available], 4);
    hydro_random_context.available -= 4;

    return v;
}